

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::CommandLineInterface::Clear(CommandLineInterface *this)

{
  (this->executable_name_)._M_string_length = 0;
  *(this->executable_name_)._M_dataplus._M_p = '\0';
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->proto_path_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->input_files_);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->direct_dependencies_).
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  std::__cxx11::string::assign((char *)&this->direct_dependencies_violation_msg_);
  std::
  vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
  ::clear(&this->output_directives_);
  (this->codec_type_)._M_string_length = 0;
  *(this->codec_type_)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->descriptor_set_in_names_);
  (this->descriptor_set_out_name_)._M_string_length = 0;
  *(this->descriptor_set_out_name_)._M_dataplus._M_p = '\0';
  (this->dependency_out_name_)._M_string_length = 0;
  *(this->dependency_out_name_)._M_dataplus._M_p = '\0';
  this->experimental_editions_ = false;
  (this->edition_defaults_out_name_)._M_string_length = 0;
  *(this->edition_defaults_out_name_)._M_dataplus._M_p = '\0';
  this->edition_defaults_minimum_ = EDITION_UNKNOWN;
  this->edition_defaults_maximum_ = EDITION_UNKNOWN;
  this->mode_ = MODE_COMPILE;
  this->print_mode_ = PRINT_NONE;
  this->direct_dependencies_explicitly_set_ = false;
  this->deterministic_output_ = false;
  this->imports_in_descriptor_set_ = false;
  this->source_info_in_descriptor_set_ = false;
  this->retain_options_in_descriptor_set_ = false;
  this->disallow_services_ = false;
  return;
}

Assistant:

void CommandLineInterface::Clear() {
  // Clear all members that are set by Run().  Note that we must not clear
  // members which are set by other methods before Run() is called.
  executable_name_.clear();
  proto_path_.clear();
  input_files_.clear();
  direct_dependencies_.clear();
  direct_dependencies_violation_msg_ = kDefaultDirectDependenciesViolationMsg;
  output_directives_.clear();
  codec_type_.clear();
  descriptor_set_in_names_.clear();
  descriptor_set_out_name_.clear();
  dependency_out_name_.clear();

  experimental_editions_ = false;
  edition_defaults_out_name_.clear();
  edition_defaults_minimum_ = EDITION_UNKNOWN;
  edition_defaults_maximum_ = EDITION_UNKNOWN;

  mode_ = MODE_COMPILE;
  print_mode_ = PRINT_NONE;
  imports_in_descriptor_set_ = false;
  source_info_in_descriptor_set_ = false;
  retain_options_in_descriptor_set_ = false;
  disallow_services_ = false;
  direct_dependencies_explicitly_set_ = false;
  deterministic_output_ = false;
}